

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmMakefileTargetGenerator::GetResponseFlag_abi_cxx11_
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,ResponseFlagFor mode)

{
  cmGeneratorTarget *this_00;
  cmValue cVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string responseFlagVar;
  string lang;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  pointer local_58;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"@","");
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  GetConfigName_abi_cxx11_(&local_78,this);
  cmGeneratorTarget::GetLinkerLanguage(&local_b8,this_00,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (mode == DeviceLink) {
    std::__cxx11::string::_M_replace((ulong)&local_d8,0,(char *)local_d8._M_string_length,0x85fba5);
  }
  else if (mode == Link) {
    local_78._M_dataplus._M_p = (pointer)0x6;
    local_78._M_string_length = 0x83b123;
    local_78.field_2._M_allocated_capacity = 0;
    local_78.field_2._8_8_ = local_b8._M_string_length;
    local_58 = local_b8._M_dataplus._M_p;
    local_50 = 0;
    local_48 = 0x18;
    local_40 = "_RESPONSE_FILE_LINK_FLAG";
    local_38 = 0;
    views._M_len = 3;
    views._M_array = (iterator)&local_78;
    cmCatViews(&local_98,views);
    std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  cVar1 = cmMakefile::GetDefinition((this->super_cmCommonTargetGenerator).Makefile,&local_d8);
  if (cVar1.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::GetResponseFlag(
  ResponseFlagFor mode) const
{
  std::string responseFlag = "@";
  std::string responseFlagVar;

  auto const lang =
    this->GeneratorTarget->GetLinkerLanguage(this->GetConfigName());
  if (mode == cmMakefileTargetGenerator::ResponseFlagFor::Link) {
    responseFlagVar = cmStrCat("CMAKE_", lang, "_RESPONSE_FILE_LINK_FLAG");
  } else if (mode == cmMakefileTargetGenerator::ResponseFlagFor::DeviceLink) {
    responseFlagVar = "CMAKE_CUDA_RESPONSE_FILE_DEVICE_LINK_FLAG";
  }

  if (cmValue const p = this->Makefile->GetDefinition(responseFlagVar)) {
    responseFlag = *p;
  }
  return responseFlag;
}